

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxCompareEq::Resolve(FxCompareEq *this,FCompileContext *ctx)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxTypeCast *pFVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  PType *pPVar6;
  undefined4 extraout_var_05;
  void *pvVar7;
  undefined4 extraout_var_06;
  PClass *source;
  FxExpression *other;
  char *local_260;
  FxBoolCast *local_148;
  FxExpression *x_1;
  undefined1 local_130 [40];
  PType *pPStack_108;
  bool rightisnull;
  FxExpression *x;
  undefined1 local_f0 [40];
  PType *pPStack_c8;
  bool leftisnull;
  FxExpression *e;
  int local_ac;
  undefined1 local_a8 [4];
  int v2_2;
  int local_94;
  undefined1 local_90 [4];
  int v1_2;
  PType *local_80;
  double v2_1;
  PType *local_68;
  double v1_1;
  undefined1 local_50 [8];
  FString v2;
  FString v1;
  int v;
  FCompileContext *ctx_local;
  FxCompareEq *this_local;
  
  if (((this->super_FxBinary).super_FxExpression.isresolved & 1U) != 0) {
    return (FxExpression *)this;
  }
  (this->super_FxBinary).super_FxExpression.isresolved = true;
  source = (PClass *)ctx;
  if ((this->super_FxBinary).left != (FxExpression *)0x0) {
    iVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[2])();
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var,iVar3);
  }
  if ((this->super_FxBinary).right != (FxExpression *)0x0) {
    source = (PClass *)ctx;
    iVar3 = (*((this->super_FxBinary).right)->_vptr_FxExpression[2])();
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_00,iVar3);
  }
  if (((this->super_FxBinary).left == (FxExpression *)0x0) ||
     ((this->super_FxBinary).right == (FxExpression *)0x0)) {
    if (this != (FxCompareEq *)0x0) {
      (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
    }
    return (FxExpression *)0x0;
  }
  if (((this->super_FxBinary).left)->ValueType == ((this->super_FxBinary).right)->ValueType) {
    iVar3 = PType::GetRegType(((this->super_FxBinary).left)->ValueType);
    if (iVar3 == 0x80) goto LAB_00765724;
    (this->super_FxBinary).super_FxExpression.ValueType = ((this->super_FxBinary).left)->ValueType;
  }
  else if (((((this->super_FxBinary).left)->ValueType == (PType *)TypeString) ||
           (((this->super_FxBinary).left)->ValueType == (PType *)TypeName)) &&
          (((((this->super_FxBinary).right)->ValueType == (PType *)TypeName ||
            (((((this->super_FxBinary).right)->ValueType == (PType *)TypeSound ||
              (((this->super_FxBinary).right)->ValueType == (PType *)TypeColor)) ||
             (source = PClassPointer::RegistrationInfo.MyClass,
             bVar2 = DObject::IsKindOf((DObject *)((this->super_FxBinary).right)->ValueType,
                                       PClassPointer::RegistrationInfo.MyClass), bVar2)))) ||
           (((this->super_FxBinary).right)->ValueType == (PType *)TypeStateLabel)))) {
    pFVar5 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
    FxTypeCast::FxTypeCast
              (pFVar5,(this->super_FxBinary).left,((this->super_FxBinary).right)->ValueType,false,
               true);
    (this->super_FxBinary).left = (FxExpression *)pFVar5;
    source = (PClass *)ctx;
    iVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[2])();
    (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var_01,iVar3);
    if ((this->super_FxBinary).left == (FxExpression *)0x0) {
      if (this != (FxCompareEq *)0x0) {
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    (this->super_FxBinary).super_FxExpression.ValueType = ((this->super_FxBinary).right)->ValueType;
  }
  else if (((((this->super_FxBinary).right)->ValueType == (PType *)TypeString) ||
           (((this->super_FxBinary).right)->ValueType == (PType *)TypeName)) &&
          (((((this->super_FxBinary).left)->ValueType == (PType *)TypeName ||
            ((((this->super_FxBinary).left)->ValueType == (PType *)TypeSound ||
             (((this->super_FxBinary).left)->ValueType == (PType *)TypeColor)))) ||
           ((source = PClassPointer::RegistrationInfo.MyClass,
            bVar2 = DObject::IsKindOf((DObject *)((this->super_FxBinary).left)->ValueType,
                                      PClassPointer::RegistrationInfo.MyClass), bVar2 ||
            (((this->super_FxBinary).left)->ValueType == (PType *)TypeStateLabel)))))) {
    pFVar5 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
    FxTypeCast::FxTypeCast
              (pFVar5,(this->super_FxBinary).right,((this->super_FxBinary).left)->ValueType,false,
               true);
    (this->super_FxBinary).right = (FxExpression *)pFVar5;
    source = (PClass *)ctx;
    iVar3 = (*((this->super_FxBinary).right)->_vptr_FxExpression[2])();
    (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_02,iVar3);
    if ((this->super_FxBinary).right == (FxExpression *)0x0) {
      if (this != (FxCompareEq *)0x0) {
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
      }
      return (FxExpression *)0x0;
    }
    (this->super_FxBinary).super_FxExpression.ValueType = ((this->super_FxBinary).left)->ValueType;
  }
  else {
    bVar2 = FxExpression::IsNumeric((this->super_FxBinary).left);
    if ((bVar2) && (bVar2 = FxExpression::IsNumeric((this->super_FxBinary).right), bVar2)) {
      source = (PClass *)ctx;
      FxBinary::Promote(&this->super_FxBinary,ctx,false);
    }
    else if ((((this->super_FxBinary).left)->ValueType == (PType *)TypeStateLabel) &&
            ((PPointer *)((this->super_FxBinary).right)->ValueType == TypeNullPtr)) {
      pFVar5 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
      source = (PClass *)(this->super_FxBinary).right;
      FxTypeCast::FxTypeCast(pFVar5,(FxExpression *)source,(PType *)TypeStateLabel,false,false);
      (this->super_FxBinary).right = (FxExpression *)pFVar5;
      if ((this->super_FxBinary).right != (FxExpression *)0x0) {
        source = (PClass *)ctx;
        iVar3 = (*((this->super_FxBinary).right)->_vptr_FxExpression[2])();
        (this->super_FxBinary).right = (FxExpression *)CONCAT44(extraout_var_03,iVar3);
      }
      if ((this->super_FxBinary).right == (FxExpression *)0x0) {
        if (this != (FxCompareEq *)0x0) {
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    else if ((((this->super_FxBinary).right)->ValueType == (PType *)TypeStateLabel) &&
            ((PPointer *)((this->super_FxBinary).left)->ValueType == TypeNullPtr)) {
      pFVar5 = (FxTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
      source = (PClass *)(this->super_FxBinary).left;
      FxTypeCast::FxTypeCast(pFVar5,(FxExpression *)source,(PType *)TypeStateLabel,false,false);
      (this->super_FxBinary).left = (FxExpression *)pFVar5;
      if ((this->super_FxBinary).left != (FxExpression *)0x0) {
        source = (PClass *)ctx;
        iVar3 = (*((this->super_FxBinary).left)->_vptr_FxExpression[2])();
        (this->super_FxBinary).left = (FxExpression *)CONCAT44(extraout_var_04,iVar3);
      }
      if ((this->super_FxBinary).left == (FxExpression *)0x0) {
        if (this != (FxCompareEq *)0x0) {
          (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
        }
        return (FxExpression *)0x0;
      }
    }
    else {
      iVar3 = PType::GetRegType(((this->super_FxBinary).left)->ValueType);
      if ((iVar3 != 3) ||
         (iVar3 = PType::GetRegType(((this->super_FxBinary).right)->ValueType), iVar3 != 3))
      goto LAB_00765724;
      if ((((this->super_FxBinary).left)->ValueType != ((this->super_FxBinary).right)->ValueType) &&
         (((PPointer *)((this->super_FxBinary).right)->ValueType != TypeNullPtr &&
          ((PPointer *)((this->super_FxBinary).left)->ValueType != TypeNullPtr)))) {
        source = (PClass *)((this->super_FxBinary).right)->ValueType;
        bVar2 = AreCompatiblePointerTypes
                          (((this->super_FxBinary).left)->ValueType,(PType *)source,true);
        if (!bVar2) goto LAB_00765724;
      }
    }
  }
  if ((((this->super_FxBinary).Operator != 0x121) ||
      (iVar3 = PType::GetRegType((this->super_FxBinary).super_FxExpression.ValueType), iVar3 == 1))
     || (iVar3 = PType::GetRegType((this->super_FxBinary).super_FxExpression.ValueType), iVar3 == 2)
     ) {
    uVar4 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
    if (((uVar4 & 1) != 0) &&
       (uVar4 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])(), (uVar4 & 1) != 0)) {
      if ((this->super_FxBinary).super_FxExpression.ValueType == (PType *)TypeString) {
        FxConstant::GetValue((FxConstant *)&v2);
        ExpVal::GetString((ExpVal *)&stack0xffffffffffffffc8);
        ExpVal::~ExpVal((ExpVal *)&v2);
        FxConstant::GetValue((FxConstant *)&v1_1);
        ExpVal::GetString((ExpVal *)local_50);
        ExpVal::~ExpVal((ExpVal *)&v1_1);
        if ((this->super_FxBinary).Operator == 0x121) {
          other = (FxExpression *)local_50;
          iVar3 = FString::CompareNoCase((FString *)&stack0xffffffffffffffc8,(FString *)other);
          v1.Chars._0_4_ = (uint)((iVar3 != 0 ^ 0xffU) & 1);
        }
        else {
          other = (FxExpression *)local_50;
          iVar3 = FString::Compare((FString *)&stack0xffffffffffffffc8,(FString *)other);
          v1.Chars._0_4_ = (uint)(iVar3 != 0);
          if ((this->super_FxBinary).Operator == 0x11f) {
            v1.Chars._0_4_ = (uint)(((uint)v1.Chars != 0 ^ 0xffU) & 1);
          }
        }
        FString::~FString((FString *)local_50);
        FString::~FString((FString *)&stack0xffffffffffffffc8);
      }
      else {
        iVar3 = PType::GetRegType((this->super_FxBinary).super_FxExpression.ValueType);
        if (iVar3 == 1) {
          FxConstant::GetValue((FxConstant *)&v2_1);
          pPVar6 = (PType *)ExpVal::GetFloat((ExpVal *)&v2_1);
          ExpVal::~ExpVal((ExpVal *)&v2_1);
          other = (this->super_FxBinary).right;
          local_68 = pPVar6;
          FxConstant::GetValue((FxConstant *)local_90);
          pPVar6 = (PType *)ExpVal::GetFloat((ExpVal *)local_90);
          ExpVal::~ExpVal((ExpVal *)local_90);
          local_80 = pPVar6;
          if ((this->super_FxBinary).Operator == 0x11f) {
            v1.Chars._0_1_ = (double)local_68 == (double)pPVar6;
          }
          else if ((this->super_FxBinary).Operator == 0x120) {
            v1.Chars._0_1_ = (double)local_68 != (double)pPVar6;
          }
          else {
            v1.Chars._0_1_ = ABS((double)local_68 - (double)pPVar6) < 1.52587890625e-05;
          }
        }
        else {
          FxConstant::GetValue((FxConstant *)local_a8);
          iVar3 = ExpVal::GetInt((ExpVal *)local_a8);
          ExpVal::~ExpVal((ExpVal *)local_a8);
          other = (this->super_FxBinary).right;
          local_94 = iVar3;
          FxConstant::GetValue((FxConstant *)&e);
          iVar3 = ExpVal::GetInt((ExpVal *)&e);
          ExpVal::~ExpVal((ExpVal *)&e);
          local_ac = iVar3;
          if ((this->super_FxBinary).Operator == 0x11f) {
            v1.Chars._0_1_ = local_94 == iVar3;
          }
          else {
            v1.Chars._0_1_ = local_94 != iVar3;
          }
        }
        v1.Chars._1_3_ = 0;
      }
      pPVar6 = (PType *)FxExpression::operator_new((FxExpression *)0x38,(size_t)other);
      FxConstant::FxConstant
                ((FxConstant *)pPVar6,(uint)v1.Chars,
                 &(this->super_FxBinary).super_FxExpression.ScriptPosition);
      pPStack_c8 = pPVar6;
      if (this != (FxCompareEq *)0x0) {
        (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
      }
      return (FxExpression *)pPStack_c8;
    }
    if ((this->super_FxBinary).Operator != 0x121) {
      uVar4 = (*((this->super_FxBinary).left)->_vptr_FxExpression[3])();
      if ((uVar4 & 1) != 0) {
        iVar3 = PType::GetRegType(((this->super_FxBinary).left)->ValueType);
        if (iVar3 == 0) {
          source = (PClass *)(this->super_FxBinary).left;
          FxConstant::GetValue((FxConstant *)(local_f0 + 0x10));
          iVar3 = ExpVal::GetInt((ExpVal *)(local_f0 + 0x10));
          local_f0[0x27] = iVar3 == 0;
          ExpVal::~ExpVal((ExpVal *)(local_f0 + 0x10));
        }
        else if (iVar3 == 1) {
          iVar3 = PType::GetRegCount(((this->super_FxBinary).left)->ValueType);
          if (iVar3 != 1) {
            __assert_fail("left->ValueType->GetRegCount() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xd83,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
          }
          source = (PClass *)(this->super_FxBinary).left;
          FxConstant::GetValue((FxConstant *)local_f0);
          dVar1 = ExpVal::GetFloat((ExpVal *)local_f0);
          local_f0[0x27] = dVar1 == 0.0;
          ExpVal::~ExpVal((ExpVal *)local_f0);
        }
        else if (iVar3 == 3) {
          source = (PClass *)(this->super_FxBinary).left;
          FxConstant::GetValue((FxConstant *)&x);
          pvVar7 = ExpVal::GetPointer((ExpVal *)&x);
          local_f0[0x27] = pvVar7 == (void *)0x0;
          ExpVal::~ExpVal((ExpVal *)&x);
        }
        else {
          local_f0[0x27] = EFX_Expression >> 0x18;
        }
        if ((local_f0[0x27] & 1) != EFX_Expression >> 0x18) {
          if ((this->super_FxBinary).Operator == 0x11f) {
            pPVar6 = (PType *)FxExpression::operator_new((FxExpression *)0x30,(size_t)source);
            FxUnaryNotBoolean::FxUnaryNotBoolean
                      ((FxUnaryNotBoolean *)pPVar6,(this->super_FxBinary).right);
            pPStack_108 = pPVar6;
          }
          else {
            pPVar6 = (PType *)FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
            FxBoolCast::FxBoolCast((FxBoolCast *)pPVar6,(this->super_FxBinary).right,true);
            pPStack_108 = pPVar6;
          }
          (this->super_FxBinary).right = (FxExpression *)0x0;
          if (this != (FxCompareEq *)0x0) {
            (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
          }
          iVar3 = (*((FxExpression *)&pPStack_108->super_PTypeBase)->_vptr_FxExpression[2])
                            (pPStack_108,ctx);
          return (FxExpression *)CONCAT44(extraout_var_05,iVar3);
        }
      }
      uVar4 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
      if ((uVar4 & 1) != 0) {
        iVar3 = PType::GetRegType(((this->super_FxBinary).right)->ValueType);
        if (iVar3 == 0) {
          source = (PClass *)(this->super_FxBinary).right;
          FxConstant::GetValue((FxConstant *)(local_130 + 0x10));
          iVar3 = ExpVal::GetInt((ExpVal *)(local_130 + 0x10));
          local_130[0x27] = iVar3 == 0;
          ExpVal::~ExpVal((ExpVal *)(local_130 + 0x10));
        }
        else if (iVar3 == 1) {
          iVar3 = PType::GetRegCount(((this->super_FxBinary).right)->ValueType);
          if (iVar3 != 1) {
            __assert_fail("right->ValueType->GetRegCount() == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                          ,0xda3,"virtual FxExpression *FxCompareEq::Resolve(FCompileContext &)");
          }
          source = (PClass *)(this->super_FxBinary).right;
          FxConstant::GetValue((FxConstant *)local_130);
          dVar1 = ExpVal::GetFloat((ExpVal *)local_130);
          local_130[0x27] = dVar1 == 0.0;
          ExpVal::~ExpVal((ExpVal *)local_130);
        }
        else if (iVar3 == 3) {
          source = (PClass *)(this->super_FxBinary).right;
          FxConstant::GetValue((FxConstant *)&x_1);
          pvVar7 = ExpVal::GetPointer((ExpVal *)&x_1);
          local_130[0x27] = pvVar7 == (void *)0x0;
          ExpVal::~ExpVal((ExpVal *)&x_1);
        }
        else {
          local_130[0x27] = EFX_Expression >> 0x18;
        }
        if ((local_130[0x27] & 1) != EFX_Expression >> 0x18) {
          if ((this->super_FxBinary).Operator == 0x11f) {
            local_148 = (FxBoolCast *)
                        FxExpression::operator_new((FxExpression *)0x30,(size_t)source);
            FxUnaryNotBoolean::FxUnaryNotBoolean
                      ((FxUnaryNotBoolean *)local_148,(this->super_FxBinary).left);
          }
          else {
            local_148 = (FxBoolCast *)
                        FxExpression::operator_new((FxExpression *)0x38,(size_t)source);
            FxBoolCast::FxBoolCast(local_148,(this->super_FxBinary).left,true);
          }
          (this->super_FxBinary).left = (FxExpression *)0x0;
          if (this != (FxCompareEq *)0x0) {
            (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
          }
          iVar3 = (*(local_148->super_FxExpression)._vptr_FxExpression[2])(local_148,ctx);
          return (FxExpression *)CONCAT44(extraout_var_06,iVar3);
        }
      }
    }
    (this->super_FxBinary).super_FxExpression.ValueType = (PType *)TypeBool;
    return (FxExpression *)this;
  }
LAB_00765724:
  if ((this->super_FxBinary).Operator == 0x11f) {
    local_260 = "==";
  }
  else {
    local_260 = "~==";
    if ((this->super_FxBinary).Operator == 0x120) {
      local_260 = "!=";
    }
  }
  FScriptPosition::Message
            (&(this->super_FxBinary).super_FxExpression.ScriptPosition,2,
             "Incompatible operands for %s comparison",local_260);
  if (this != (FxCompareEq *)0x0) {
    (*(this->super_FxBinary).super_FxExpression._vptr_FxExpression[1])();
  }
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxCompareEq::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();

	RESOLVE(left, ctx);
	RESOLVE(right, ctx);
	if (!left || !right)
	{
		delete this;
		return nullptr;
	}

	if (left->ValueType != right->ValueType)	// identical types are always comparable, if they can be placed in a register, so we can save most checks if this is the case.
	{
		// Special cases: Compare strings and names with names, sounds, colors, state labels and class types.
		// These are all types a string can be implicitly cast into, so for convenience, so they should when doing a comparison.
		if ((left->ValueType == TypeString || left->ValueType == TypeName) &&
			(right->ValueType == TypeName || right->ValueType == TypeSound || right->ValueType == TypeColor || right->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || right->ValueType == TypeStateLabel))
		{
			left = new FxTypeCast(left, right->ValueType, false, true);
			left = left->Resolve(ctx);
			ABORT(left);
			ValueType = right->ValueType;
		}
		else if ((right->ValueType == TypeString || right->ValueType == TypeName) &&
			(left->ValueType == TypeName || left->ValueType == TypeSound || left->ValueType == TypeColor || left->ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) || left->ValueType == TypeStateLabel))
		{
			right = new FxTypeCast(right, left->ValueType, false, true);
			right = right->Resolve(ctx);
			ABORT(right);
			ValueType = left->ValueType;
		}
		else if (left->IsNumeric() && right->IsNumeric())
		{
			Promote(ctx);
		}
		// allows comparing state labels with null pointers.
		else if (left->ValueType == TypeStateLabel && right->ValueType == TypeNullPtr)
		{
			right = new FxTypeCast(right, TypeStateLabel, false);
			SAFE_RESOLVE(right, ctx);
		}
		else if (right->ValueType == TypeStateLabel && left->ValueType == TypeNullPtr)
		{
			left = new FxTypeCast(left, TypeStateLabel, false);
			SAFE_RESOLVE(left, ctx);
		}
		else if (left->ValueType->GetRegType() == REGT_POINTER && right->ValueType->GetRegType() == REGT_POINTER)
		{
			if (left->ValueType != right->ValueType && right->ValueType != TypeNullPtr && left->ValueType != TypeNullPtr &&
				!AreCompatiblePointerTypes(left->ValueType, right->ValueType, true))
			{
				goto error;
			}
		}
		else
		{
			goto error;
		}
	}
	else if (left->ValueType->GetRegType() == REGT_NIL)
	{
		goto error;
	}
	else
	{
		ValueType = left->ValueType;
	}

	if (Operator == TK_ApproxEq && ValueType->GetRegType() != REGT_FLOAT && ValueType->GetRegType() != REGT_STRING)
	{
		// Only floats, vectors and strings have handling for '~==', for all other types this is an error.
		goto error;
	}

	if (left->isConstant() && right->isConstant())
	{
		int v;

		if (ValueType == TypeString)
		{
			FString v1 = static_cast<FxConstant *>(left)->GetValue().GetString();
			FString v2 = static_cast<FxConstant *>(right)->GetValue().GetString();
			if (Operator == TK_ApproxEq) v = !v1.CompareNoCase(v2);
			else
			{
				v = !!v1.Compare(v2);
				if (Operator == TK_Eq) v = !v;
			}
		}
		else if (ValueType->GetRegType() == REGT_FLOAT)
		{
			double v1 = static_cast<FxConstant *>(left)->GetValue().GetFloat();
			double v2 = static_cast<FxConstant *>(right)->GetValue().GetFloat();
			v = Operator == TK_Eq? v1 == v2 : Operator == TK_Neq? v1 != v2 : fabs(v1-v2) < VM_EPSILON;
		}
		else
		{
			int v1 = static_cast<FxConstant *>(left)->GetValue().GetInt();
			int v2 = static_cast<FxConstant *>(right)->GetValue().GetInt();
			v = Operator == TK_Eq? v1 == v2 : v1 != v2;
		}
		FxExpression *e = new FxConstant(v, ScriptPosition);
		delete this;
		return e;
	}
	else
	{
		// also simplify comparisons against zero. For these a bool cast/unary not on the other value will do just as well and create better code.
		if (Operator != TK_ApproxEq)
		{
			if (left->isConstant())
			{
				bool leftisnull;
				switch (left->ValueType->GetRegType())
				{
				case REGT_INT:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(left->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					leftisnull = static_cast<FxConstant *>(left)->GetValue().GetPointer() == nullptr;
					break;

				default:
					leftisnull = false;
				}
				if (leftisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(right);
					else x = new FxBoolCast(right);
					right = nullptr;
					delete this;
					return x->Resolve(ctx);
				}

			}
			if (right->isConstant())
			{
				bool rightisnull;
				switch (right->ValueType->GetRegType())
				{
				case REGT_INT:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetInt() == 0;
					break;

				case REGT_FLOAT:
					assert(right->ValueType->GetRegCount() == 1);	// vectors should not be able to get here.
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetFloat() == 0;
					break;

				case REGT_POINTER:
					rightisnull = static_cast<FxConstant *>(right)->GetValue().GetPointer() == nullptr;
					break;

				default:
					rightisnull = false;
				}
				if (rightisnull)
				{
					FxExpression *x;
					if (Operator == TK_Eq) x = new FxUnaryNotBoolean(left);
					else x = new FxBoolCast(left);
					left = nullptr;
					delete this;
					return x->Resolve(ctx);
				}
			}
		}
	}
	ValueType = TypeBool;
	return this;

error:
	ScriptPosition.Message(MSG_ERROR, "Incompatible operands for %s comparison", Operator == TK_Eq ? "==" : Operator == TK_Neq ? "!=" : "~==");
	delete this;
	return nullptr;
}